

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O2

int ldelnewline(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  line *__ptr;
  line *__ptr_00;
  char *__dest;
  line *plVar4;
  mgwin *pmVar5;
  int iVar6;
  line *plVar7;
  mgwin **ppmVar8;
  
  iVar6 = checkdirty(curbp);
  pmVar5 = curwp;
  if (iVar6 == 1) {
    if ((curbp->b_flag & 0x10U) == 0) {
      __ptr = curwp->w_dotp;
      __ptr_00 = __ptr->l_fp;
      iVar6 = 1;
      if (__ptr_00 != curbp->b_headp) {
        piVar1 = &curwp->w_bufp->b_lines;
        *piVar1 = *piVar1 + -1;
        if (pmVar5->w_dotline < pmVar5->w_markline) {
          pmVar5->w_markline = pmVar5->w_markline + -1;
        }
        iVar2 = __ptr_00->l_used;
        iVar3 = __ptr->l_used;
        if (__ptr->l_size - iVar3 < iVar2) {
          plVar7 = lalloc(iVar3 + iVar2);
          if (plVar7 == (line *)0x0) {
            return 0;
          }
          __dest = plVar7->l_text;
          memmove(__dest,__ptr->l_text,(long)__ptr->l_used);
          memmove(__dest + __ptr->l_used,__ptr_00->l_text,(long)__ptr_00->l_used);
          __ptr->l_bp->l_fp = plVar7;
          plVar4 = __ptr_00->l_fp;
          plVar7->l_fp = plVar4;
          plVar4->l_bp = plVar7;
          plVar7->l_bp = __ptr->l_bp;
          ppmVar8 = &wheadp;
          while (ppmVar8 = (mgwin **)(((mgwin *)ppmVar8)->w_list).l_p.l_wp,
                (mgwin *)ppmVar8 != (mgwin *)0x0) {
            if (((mgwin *)ppmVar8)->w_linep == __ptr || ((mgwin *)ppmVar8)->w_linep == __ptr_00) {
              ((mgwin *)ppmVar8)->w_linep = plVar7;
            }
            if (((mgwin *)ppmVar8)->w_dotp == __ptr) {
              ((mgwin *)ppmVar8)->w_dotp = plVar7;
            }
            else if (((mgwin *)ppmVar8)->w_dotp == __ptr_00) {
              ((mgwin *)ppmVar8)->w_dotp = plVar7;
              ((mgwin *)ppmVar8)->w_doto = ((mgwin *)ppmVar8)->w_doto + __ptr->l_used;
            }
            if (((mgwin *)ppmVar8)->w_markp == __ptr) {
              ((mgwin *)ppmVar8)->w_markp = plVar7;
            }
            else if (((mgwin *)ppmVar8)->w_markp == __ptr_00) {
              ((mgwin *)ppmVar8)->w_markp = plVar7;
              ((mgwin *)ppmVar8)->w_marko = ((mgwin *)ppmVar8)->w_marko + __ptr->l_used;
            }
          }
          free(__ptr);
        }
        else {
          memmove(__ptr->l_text + iVar3,__ptr_00->l_text,(long)iVar2);
          ppmVar8 = &wheadp;
          while (ppmVar8 = (mgwin **)(((mgwin *)ppmVar8)->w_list).l_p.l_wp,
                (mgwin *)ppmVar8 != (mgwin *)0x0) {
            if (((mgwin *)ppmVar8)->w_linep == __ptr_00) {
              ((mgwin *)ppmVar8)->w_linep = __ptr;
            }
            if (((mgwin *)ppmVar8)->w_dotp == __ptr_00) {
              ((mgwin *)ppmVar8)->w_dotp = __ptr;
              ((mgwin *)ppmVar8)->w_doto = ((mgwin *)ppmVar8)->w_doto + __ptr->l_used;
            }
            if (((mgwin *)ppmVar8)->w_markp == __ptr_00) {
              ((mgwin *)ppmVar8)->w_markp = __ptr;
              ((mgwin *)ppmVar8)->w_marko = ((mgwin *)ppmVar8)->w_marko + __ptr->l_used;
            }
          }
          __ptr->l_used = __ptr->l_used + __ptr_00->l_used;
          plVar7 = __ptr_00->l_fp;
          __ptr->l_fp = plVar7;
          plVar7->l_bp = __ptr;
        }
        free(__ptr_00);
      }
    }
    else {
      dobeep();
      iVar6 = 0;
      ewprintf("Buffer is read only");
    }
  }
  return iVar6;
}

Assistant:

int
ldelnewline(void)
{
	struct line	*lp1, *lp2, *lp3;
	struct mgwin	*wp;
	int s;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	lp1 = curwp->w_dotp;
	lp2 = lp1->l_fp;
	/* at the end of the buffer */
	if (lp2 == curbp->b_headp)
		return (TRUE);
	/* Keep line counts in sync */
	curwp->w_bufp->b_lines--;
	if (curwp->w_markline > curwp->w_dotline)
		curwp->w_markline--;
	if (lp2->l_used <= lp1->l_size - lp1->l_used) {
		bcopy(&lp2->l_text[0], &lp1->l_text[lp1->l_used], lp2->l_used);
		for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
			if (wp->w_linep == lp2)
				wp->w_linep = lp1;
			if (wp->w_dotp == lp2) {
				wp->w_dotp = lp1;
				wp->w_doto += lp1->l_used;
			}
			if (wp->w_markp == lp2) {
				wp->w_markp = lp1;
				wp->w_marko += lp1->l_used;
			}
		}
		lp1->l_used += lp2->l_used;
		lp1->l_fp = lp2->l_fp;
		lp2->l_fp->l_bp = lp1;
		free(lp2);
		return (TRUE);
	}
	if ((lp3 = lalloc(lp1->l_used + lp2->l_used)) == NULL)
		return (FALSE);
	bcopy(&lp1->l_text[0], &lp3->l_text[0], lp1->l_used);
	bcopy(&lp2->l_text[0], &lp3->l_text[lp1->l_used], lp2->l_used);
	lp1->l_bp->l_fp = lp3;
	lp3->l_fp = lp2->l_fp;
	lp2->l_fp->l_bp = lp3;
	lp3->l_bp = lp1->l_bp;
	for (wp = wheadp; wp != NULL; wp = wp->w_wndp) {
		if (wp->w_linep == lp1 || wp->w_linep == lp2)
			wp->w_linep = lp3;
		if (wp->w_dotp == lp1)
			wp->w_dotp = lp3;
		else if (wp->w_dotp == lp2) {
			wp->w_dotp = lp3;
			wp->w_doto += lp1->l_used;
		}
		if (wp->w_markp == lp1)
			wp->w_markp = lp3;
		else if (wp->w_markp == lp2) {
			wp->w_markp = lp3;
			wp->w_marko += lp1->l_used;
		}
	}
	free(lp1);
	free(lp2);
	return (TRUE);
}